

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx2::ConeCurveMiMBIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *line)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  uint uVar84;
  uint uVar85;
  long lVar86;
  Scene *pSVar87;
  ulong uVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar114;
  float fVar115;
  float fVar121;
  float fVar123;
  float fVar125;
  undefined1 auVar116 [32];
  float fVar122;
  float fVar124;
  float fVar126;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined4 uVar127;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar145;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  float fVar167;
  float fVar168;
  undefined1 auVar169 [28];
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  float fVar183;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar177;
  float fVar179;
  float fVar181;
  undefined1 auVar175 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar188;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  int local_644;
  RayQueryContext *local_640;
  Scene *local_638;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  undefined4 local_624;
  undefined4 local_620;
  uint local_61c;
  uint local_618;
  uint local_614;
  uint local_610;
  undefined1 local_600 [32];
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  RayHit *local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  uint local_200 [4];
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [32];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  local_488 = ray;
  local_640 = context;
  pSVar87 = context->scene;
  local_200[0] = line->sharedGeomID;
  local_638 = pSVar87;
  pGVar14 = (pSVar87->geometries).items[local_200[0]].ptr;
  fVar2 = (pGVar14->time_range).lower;
  fVar2 = pGVar14->fnumTimeSegments *
          (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar2) /
          ((pGVar14->time_range).upper - fVar2));
  auVar36 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  auVar36 = vminss_avx(auVar36,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
  auVar36 = vmaxss_avx(ZEXT816(0) << 0x20,auVar36);
  uVar85 = (line->v0).field_0.i[0];
  lVar15 = *(long *)&pGVar14[3].time_range.upper;
  lVar86 = (long)(int)auVar36._0_4_ * 0x38;
  lVar16 = *(long *)(lVar15 + lVar86);
  lVar17 = *(long *)(lVar15 + 0x10 + lVar86);
  uVar84 = (line->v0).field_0.i[1];
  uVar8 = (line->v0).field_0.i[2];
  uVar9 = (line->v0).field_0.i[4];
  auVar116._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar9);
  auVar116._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar85);
  uVar10 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar16 + lVar17 * (ulong)uVar10);
  uStack_530 = *puVar1;
  _local_540 = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar84);
  uStack_528 = puVar1[1];
  uVar11 = (line->v0).field_0.i[6];
  auVar139._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar11);
  auVar139._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar8);
  uVar12 = (line->v0).field_0.i[3];
  uVar13 = (line->v0).field_0.i[7];
  auVar101._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar13);
  auVar101._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar12);
  puVar1 = (undefined8 *)(lVar16 + lVar17 * (ulong)(uVar9 + 1));
  local_460._16_8_ = *puVar1;
  local_460._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar85 + 1));
  local_460._24_8_ = puVar1[1];
  puVar1 = (undefined8 *)(lVar16 + lVar17 * (ulong)(uVar10 + 1));
  local_480._16_8_ = *puVar1;
  local_480._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar84 + 1));
  local_480._24_8_ = puVar1[1];
  auVar159._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar11 + 1));
  auVar159._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar8 + 1));
  auVar170._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar13 + 1));
  auVar170._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar12 + 1));
  lVar16 = *(long *)(lVar15 + 0x38 + lVar86);
  lVar15 = *(long *)(lVar15 + 0x48 + lVar86);
  auVar184._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar9 * lVar15);
  auVar184._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar85 * lVar15);
  auVar189._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar10 * lVar15);
  auVar189._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar84 * lVar15);
  auVar199._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar11 * lVar15);
  auVar199._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar8 * lVar15);
  auVar205._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar13 * lVar15);
  auVar205._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar12 * lVar15);
  auVar208._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar9 + 1) * lVar15);
  auVar208._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar85 + 1) * lVar15);
  auVar128._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar11 + 1) * lVar15);
  auVar128._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar8 + 1) * lVar15);
  fVar2 = fVar2 - auVar36._0_4_;
  auVar108 = vunpcklps_avx(auVar116,auVar139);
  auVar109 = vunpckhps_avx(auVar116,auVar139);
  auVar119 = vunpcklps_avx(_local_540,auVar101);
  auVar96 = vunpckhps_avx(_local_540,auVar101);
  auVar38 = vunpcklps_avx(auVar108,auVar119);
  auVar119 = vunpckhps_avx(auVar108,auVar119);
  auVar39 = vunpcklps_avx(auVar109,auVar96);
  auVar109 = vunpckhps_avx(auVar109,auVar96);
  auVar101 = vunpcklps_avx(local_460,auVar159);
  auVar96 = vunpckhps_avx(local_460,auVar159);
  auVar191 = vunpcklps_avx(local_480,auVar170);
  auVar164 = vunpckhps_avx(local_480,auVar170);
  auVar40 = vunpcklps_avx(auVar101,auVar191);
  auVar101 = vunpckhps_avx(auVar101,auVar191);
  auVar41 = vunpcklps_avx(auVar96,auVar164);
  auVar96 = vunpckhps_avx(auVar96,auVar164);
  auVar203 = vunpcklps_avx(auVar184,auVar199);
  auVar164 = vunpckhps_avx(auVar184,auVar199);
  auVar42 = vunpcklps_avx(auVar189,auVar205);
  auVar191 = vunpckhps_avx(auVar189,auVar205);
  auVar43 = vunpcklps_avx(auVar203,auVar42);
  auVar203 = vunpckhps_avx(auVar203,auVar42);
  auVar44 = vunpcklps_avx(auVar164,auVar191);
  auVar164 = vunpckhps_avx(auVar164,auVar191);
  auVar148 = vunpcklps_avx(auVar208,auVar128);
  auVar191 = vunpckhps_avx(auVar208,auVar128);
  auVar129._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar10 + 1) * lVar15);
  auVar129._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar84 + 1) * lVar15);
  auVar36 = *(undefined1 (*) [16])(lVar16 + lVar15 * (ulong)(uVar13 + 1));
  auVar190._16_16_ = auVar36;
  auVar190._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar12 + 1) * lVar15);
  auVar45 = vunpcklps_avx(auVar129,auVar190);
  auVar141 = vunpckhps_avx(auVar129,auVar190);
  auVar46 = vunpcklps_avx(auVar148,auVar45);
  auVar148 = vunpckhps_avx(auVar148,auVar45);
  auVar45 = vunpcklps_avx(auVar191,auVar141);
  auVar191 = vunpckhps_avx(auVar191,auVar141);
  fVar37 = 1.0 - fVar2;
  auVar89._4_4_ = fVar37;
  auVar89._0_4_ = fVar37;
  auVar89._8_4_ = fVar37;
  auVar89._12_4_ = fVar37;
  auVar89._16_4_ = fVar37;
  auVar89._20_4_ = fVar37;
  auVar89._24_4_ = fVar37;
  auVar89._28_4_ = fVar37;
  auVar141._4_4_ = auVar43._4_4_ * fVar2;
  auVar141._0_4_ = auVar43._0_4_ * fVar2;
  auVar141._8_4_ = auVar43._8_4_ * fVar2;
  auVar141._12_4_ = auVar43._12_4_ * fVar2;
  auVar141._16_4_ = auVar43._16_4_ * fVar2;
  auVar141._20_4_ = auVar43._20_4_ * fVar2;
  auVar141._24_4_ = auVar43._24_4_ * fVar2;
  auVar141._28_4_ = auVar42._28_4_;
  auVar47 = vfmadd231ps_fma(auVar141,auVar89,auVar38);
  auVar42._4_4_ = auVar203._4_4_ * fVar2;
  auVar42._0_4_ = auVar203._0_4_ * fVar2;
  auVar42._8_4_ = auVar203._8_4_ * fVar2;
  auVar42._12_4_ = auVar203._12_4_ * fVar2;
  auVar42._16_4_ = auVar203._16_4_ * fVar2;
  auVar42._20_4_ = auVar203._20_4_ * fVar2;
  auVar42._24_4_ = auVar203._24_4_ * fVar2;
  auVar42._28_4_ = auVar108._28_4_;
  auVar48 = vfmadd231ps_fma(auVar42,auVar89,auVar119);
  auVar119._4_4_ = auVar44._4_4_ * fVar2;
  auVar119._0_4_ = auVar44._0_4_ * fVar2;
  auVar119._8_4_ = auVar44._8_4_ * fVar2;
  auVar119._12_4_ = auVar44._12_4_ * fVar2;
  auVar119._16_4_ = auVar44._16_4_ * fVar2;
  auVar119._20_4_ = auVar44._20_4_ * fVar2;
  auVar119._24_4_ = auVar44._24_4_ * fVar2;
  auVar119._28_4_ = auVar36._12_4_;
  auVar49 = vfmadd231ps_fma(auVar119,auVar89,auVar39);
  auVar171._8_4_ = 0x3f800000;
  auVar171._0_8_ = &DAT_3f8000003f800000;
  auVar171._12_4_ = 0x3f800000;
  auVar171._16_4_ = 0x3f800000;
  auVar171._20_4_ = 0x3f800000;
  auVar171._24_4_ = 0x3f800000;
  auVar171._28_4_ = 0x3f800000;
  auVar108._4_4_ = fVar2 * auVar164._4_4_;
  auVar108._0_4_ = fVar2 * auVar164._0_4_;
  auVar108._8_4_ = fVar2 * auVar164._8_4_;
  auVar108._12_4_ = fVar2 * auVar164._12_4_;
  auVar108._16_4_ = fVar2 * auVar164._16_4_;
  auVar108._20_4_ = fVar2 * auVar164._20_4_;
  auVar108._24_4_ = fVar2 * auVar164._24_4_;
  auVar108._28_4_ = auVar164._28_4_;
  auVar50 = vfmadd231ps_fma(auVar108,auVar89,auVar109);
  auVar164._4_4_ = fVar2 * auVar46._4_4_;
  auVar164._0_4_ = fVar2 * auVar46._0_4_;
  auVar164._8_4_ = fVar2 * auVar46._8_4_;
  auVar164._12_4_ = fVar2 * auVar46._12_4_;
  auVar164._16_4_ = fVar2 * auVar46._16_4_;
  auVar164._20_4_ = fVar2 * auVar46._20_4_;
  auVar164._24_4_ = fVar2 * auVar46._24_4_;
  auVar164._28_4_ = auVar203._28_4_;
  auVar146._0_4_ = auVar148._0_4_ * fVar2;
  auVar146._4_4_ = auVar148._4_4_ * fVar2;
  auVar146._8_4_ = auVar148._8_4_ * fVar2;
  auVar146._12_4_ = auVar148._12_4_ * fVar2;
  auVar146._16_4_ = auVar148._16_4_ * fVar2;
  auVar146._20_4_ = auVar148._20_4_ * fVar2;
  auVar146._24_4_ = auVar148._24_4_ * fVar2;
  auVar146._28_4_ = 0;
  auVar203._4_4_ = auVar45._4_4_ * fVar2;
  auVar203._0_4_ = auVar45._0_4_ * fVar2;
  auVar203._8_4_ = auVar45._8_4_ * fVar2;
  auVar203._12_4_ = auVar45._12_4_ * fVar2;
  auVar203._16_4_ = auVar45._16_4_ * fVar2;
  auVar203._20_4_ = auVar45._20_4_ * fVar2;
  auVar203._24_4_ = auVar45._24_4_ * fVar2;
  auVar203._28_4_ = auVar38._28_4_;
  auVar148._4_4_ = fVar2 * auVar191._4_4_;
  auVar148._0_4_ = fVar2 * auVar191._0_4_;
  auVar148._8_4_ = fVar2 * auVar191._8_4_;
  auVar148._12_4_ = fVar2 * auVar191._12_4_;
  auVar148._16_4_ = fVar2 * auVar191._16_4_;
  auVar148._20_4_ = fVar2 * auVar191._20_4_;
  auVar148._24_4_ = fVar2 * auVar191._24_4_;
  auVar148._28_4_ = auVar191._28_4_;
  auVar51 = vfmadd231ps_fma(auVar164,auVar89,auVar40);
  auVar52 = vfmadd231ps_fma(auVar146,auVar89,auVar101);
  auVar53 = vfmadd231ps_fma(auVar203,auVar89,auVar41);
  auVar54 = vfmadd231ps_fma(auVar148,auVar89,auVar96);
  uVar6 = line->leftExists;
  uVar7 = line->rightExists;
  auVar109 = vpcmpeqd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar54));
  auVar101 = vpcmpeqd_avx2(auVar109,(undefined1  [32])(line->primIDs).field_0);
  local_200[1] = local_200[0];
  local_200[2] = local_200[0];
  local_200[3] = local_200[0];
  uStack_1f0 = local_200[0];
  uStack_1ec = local_200[0];
  uStack_1e8 = local_200[0];
  uStack_1e4 = local_200[0];
  fVar2 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar102._4_4_ = fVar2;
  auVar102._0_4_ = fVar2;
  auVar102._8_4_ = fVar2;
  auVar102._12_4_ = fVar2;
  auVar102._16_4_ = fVar2;
  auVar102._20_4_ = fVar2;
  auVar102._24_4_ = fVar2;
  auVar102._28_4_ = fVar2;
  auVar109._0_16_ = *(undefined1 (*) [16])&(ray->super_RayK<1>).dir;
  auVar109._16_4_ = (ray->super_RayK<1>).tfar;
  auVar109._20_4_ = (ray->super_RayK<1>).mask;
  auVar109._24_4_ = (ray->super_RayK<1>).id;
  auVar109._28_4_ = (ray->super_RayK<1>).flags;
  auVar96 = *(undefined1 (*) [32])((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  fVar37 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar4 = (ray->super_RayK<1>).tfar;
  fVar5 = (float)(ray->super_RayK<1>).mask;
  fVar19 = (float)(ray->super_RayK<1>).id;
  fVar20 = (float)(ray->super_RayK<1>).flags;
  fVar21 = (ray->Ng).field_0.field_0.x;
  auVar191._4_4_ = fVar3 * fVar3;
  auVar191._0_4_ = fVar37 * fVar37;
  auVar191._8_4_ = fVar4 * fVar4;
  auVar191._12_4_ = fVar5 * fVar5;
  auVar191._16_4_ = fVar19 * fVar19;
  auVar191._20_4_ = fVar20 * fVar20;
  auVar191._24_4_ = fVar21 * fVar21;
  auVar191._28_4_ = (ray->Ng).field_0.field_0.y;
  auVar36 = vfmadd231ps_fma(auVar191,auVar96,auVar96);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar109,auVar109);
  uVar127 = auVar36._0_4_;
  auVar90._4_4_ = uVar127;
  auVar90._0_4_ = uVar127;
  auVar90._8_4_ = uVar127;
  auVar90._12_4_ = uVar127;
  auVar90._16_4_ = uVar127;
  auVar90._20_4_ = uVar127;
  auVar90._24_4_ = uVar127;
  auVar90._28_4_ = uVar127;
  auVar109 = vrcpps_avx(auVar90);
  auVar36 = vfnmadd213ps_fma(auVar90,auVar109,auVar171);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar109,auVar109);
  fVar37 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar172._4_4_ = fVar37;
  auVar172._0_4_ = fVar37;
  auVar172._8_4_ = fVar37;
  auVar172._12_4_ = fVar37;
  auVar172._16_4_ = fVar37;
  auVar172._20_4_ = fVar37;
  auVar172._24_4_ = fVar37;
  auVar172._28_4_ = fVar37;
  auVar109 = vsubps_avx(ZEXT1632(CONCAT412((auVar48._12_4_ + auVar52._12_4_) * 0.5,
                                           CONCAT48((auVar48._8_4_ + auVar52._8_4_) * 0.5,
                                                    CONCAT44((auVar48._4_4_ + auVar52._4_4_) * 0.5,
                                                             (auVar48._0_4_ + auVar52._0_4_) * 0.5))
                                          )),auVar102);
  auVar96 = vsubps_avx(ZEXT1632(CONCAT412((auVar49._12_4_ + auVar53._12_4_) * 0.5,
                                          CONCAT48((auVar49._8_4_ + auVar53._8_4_) * 0.5,
                                                   CONCAT44((auVar49._4_4_ + auVar53._4_4_) * 0.5,
                                                            (auVar49._0_4_ + auVar53._0_4_) * 0.5)))
                               ),auVar172);
  local_400 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar38._4_4_ = local_400 * auVar96._4_4_;
  auVar38._0_4_ = local_400 * auVar96._0_4_;
  auVar38._8_4_ = local_400 * auVar96._8_4_;
  auVar38._12_4_ = local_400 * auVar96._12_4_;
  auVar38._16_4_ = local_400 * auVar96._16_4_;
  auVar38._20_4_ = local_400 * auVar96._20_4_;
  auVar38._24_4_ = local_400 * auVar96._24_4_;
  auVar38._28_4_ = auVar96._28_4_;
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_500._4_4_ = fVar3;
  local_500._0_4_ = fVar3;
  local_500._8_4_ = fVar3;
  local_500._12_4_ = fVar3;
  local_500._16_4_ = fVar3;
  local_500._20_4_ = fVar3;
  local_500._24_4_ = fVar3;
  local_500._28_4_ = fVar3;
  auVar55 = vfmadd231ps_fma(auVar38,local_500,auVar109);
  fVar4 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar130._4_4_ = fVar4;
  auVar130._0_4_ = fVar4;
  auVar130._8_4_ = fVar4;
  auVar130._12_4_ = fVar4;
  auVar130._16_4_ = fVar4;
  auVar130._20_4_ = fVar4;
  auVar130._24_4_ = fVar4;
  auVar130._28_4_ = fVar4;
  fVar5 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_520._4_4_ = fVar5;
  local_520._0_4_ = fVar5;
  local_520._8_4_ = fVar5;
  local_520._12_4_ = fVar5;
  local_520._16_4_ = fVar5;
  local_520._20_4_ = fVar5;
  local_520._24_4_ = fVar5;
  local_520._28_4_ = fVar5;
  auVar109 = vsubps_avx(ZEXT1632(CONCAT412((auVar51._12_4_ + auVar47._12_4_) * 0.5,
                                           CONCAT48((auVar51._8_4_ + auVar47._8_4_) * 0.5,
                                                    CONCAT44((auVar51._4_4_ + auVar47._4_4_) * 0.5,
                                                             (auVar51._0_4_ + auVar47._0_4_) * 0.5))
                                          )),auVar130);
  auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),local_520,auVar109);
  fVar114 = auVar55._0_4_ * auVar36._0_4_;
  fVar121 = auVar55._4_4_ * auVar36._4_4_;
  fVar123 = auVar55._8_4_ * auVar36._8_4_;
  fVar125 = auVar55._12_4_ * auVar36._12_4_;
  fStack_4c4 = auVar109._28_4_;
  auVar131._0_4_ = fVar4 + fVar5 * fVar114;
  auVar131._4_4_ = fVar4 + fVar5 * fVar121;
  auVar131._8_4_ = fVar4 + fVar5 * fVar123;
  auVar131._12_4_ = fVar4 + fVar5 * fVar125;
  auVar131._16_4_ = fVar4 + fVar5 * 0.0;
  auVar131._20_4_ = fVar4 + fVar5 * 0.0;
  auVar131._24_4_ = fVar4 + fVar5 * 0.0;
  auVar131._28_4_ = fVar4 + 0.0;
  auVar103._0_4_ = fVar2 + fVar3 * fVar114;
  auVar103._4_4_ = fVar2 + fVar3 * fVar121;
  auVar103._8_4_ = fVar2 + fVar3 * fVar123;
  auVar103._12_4_ = fVar2 + fVar3 * fVar125;
  auVar103._16_4_ = fVar2 + fVar3 * 0.0;
  auVar103._20_4_ = fVar2 + fVar3 * 0.0;
  auVar103._24_4_ = fVar2 + fVar3 * 0.0;
  auVar103._28_4_ = fVar2 + 0.0;
  _local_4e0 = ZEXT1628(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar114))));
  auVar140._0_4_ = fVar37 + local_400 * fVar114;
  auVar140._4_4_ = fVar37 + local_400 * fVar121;
  auVar140._8_4_ = fVar37 + local_400 * fVar123;
  auVar140._12_4_ = fVar37 + local_400 * fVar125;
  auVar140._16_4_ = fVar37 + local_400 * 0.0;
  auVar140._20_4_ = fVar37 + local_400 * 0.0;
  auVar140._24_4_ = fVar37 + local_400 * 0.0;
  auVar140._28_4_ = fVar37 + 0.0;
  local_440 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar47));
  _local_540 = vsubps_avx(auVar131,ZEXT1632(auVar47));
  local_460 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar48));
  _local_4c0 = vsubps_avx(auVar103,ZEXT1632(auVar48));
  local_480 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar49));
  local_420 = vsubps_avx(auVar140,ZEXT1632(auVar49));
  fVar20 = local_480._0_4_;
  auVar147._0_4_ = fVar20 * fVar20;
  fVar24 = local_480._4_4_;
  auVar147._4_4_ = fVar24 * fVar24;
  fVar26 = local_480._8_4_;
  auVar147._8_4_ = fVar26 * fVar26;
  fVar28 = local_480._12_4_;
  auVar147._12_4_ = fVar28 * fVar28;
  fVar30 = local_480._16_4_;
  auVar147._16_4_ = fVar30 * fVar30;
  fVar32 = local_480._20_4_;
  auVar147._20_4_ = fVar32 * fVar32;
  fVar34 = local_480._24_4_;
  auVar147._24_4_ = fVar34 * fVar34;
  auVar147._28_4_ = 0;
  auVar36 = vfmadd231ps_fma(auVar147,local_460,local_460);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),local_440,local_440);
  fVar21 = local_420._0_4_;
  auVar185._0_4_ = fVar20 * fVar21;
  fVar25 = local_420._4_4_;
  auVar185._4_4_ = fVar24 * fVar25;
  fVar27 = local_420._8_4_;
  auVar185._8_4_ = fVar26 * fVar27;
  fVar29 = local_420._12_4_;
  auVar185._12_4_ = fVar28 * fVar29;
  fVar31 = local_420._16_4_;
  auVar185._16_4_ = fVar30 * fVar31;
  fVar33 = local_420._20_4_;
  auVar185._20_4_ = fVar32 * fVar33;
  fVar35 = local_420._24_4_;
  auVar185._24_4_ = fVar34 * fVar35;
  auVar185._28_4_ = 0;
  auVar47 = vfmadd231ps_fma(auVar185,_local_4c0,local_460);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),_local_540,local_440);
  auVar96._4_4_ = local_400 * fVar24;
  auVar96._0_4_ = local_400 * fVar20;
  auVar96._8_4_ = local_400 * fVar26;
  auVar96._12_4_ = local_400 * fVar28;
  auVar96._16_4_ = local_400 * fVar30;
  auVar96._20_4_ = local_400 * fVar32;
  auVar96._24_4_ = local_400 * fVar34;
  auVar96._28_4_ = fVar37;
  auVar48 = vfmadd231ps_fma(auVar96,local_500,local_460);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),local_520,local_440);
  auVar109 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar54));
  fVar22 = auVar109._0_4_;
  fVar154 = auVar109._4_4_;
  fVar156 = auVar109._8_4_;
  fVar177 = auVar109._12_4_;
  fVar181 = auVar109._16_4_;
  fVar182 = auVar109._20_4_;
  fVar183 = auVar109._24_4_;
  fVar2 = auVar36._0_4_;
  fVar188 = fVar22 * fVar22 + fVar2;
  fVar37 = auVar36._4_4_;
  fVar193 = fVar154 * fVar154 + fVar37;
  fVar4 = auVar36._8_4_;
  fVar194 = fVar156 * fVar156 + fVar4;
  fVar19 = auVar36._12_4_;
  fVar195 = fVar177 * fVar177 + fVar19;
  fVar196 = fVar181 * fVar181 + 0.0;
  fVar197 = fVar182 * fVar182 + 0.0;
  fVar198 = fVar183 * fVar183 + 0.0;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  auVar39._4_4_ = local_400 * fVar25;
  auVar39._0_4_ = local_400 * fVar21;
  auVar39._8_4_ = local_400 * fVar27;
  auVar39._12_4_ = local_400 * fVar29;
  auVar39._16_4_ = local_400 * fVar31;
  auVar39._20_4_ = local_400 * fVar33;
  auVar39._24_4_ = local_400 * fVar35;
  auVar39._28_4_ = local_440._28_4_;
  auVar49 = vfmadd231ps_fma(auVar39,local_500,_local_4c0);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),local_520,_local_540);
  fVar138 = fVar2 * fVar2;
  fVar142 = fVar37 * fVar37;
  fVar143 = fVar4 * fVar4;
  fVar144 = fVar19 * fVar19;
  uStack_264 = auVar140._28_4_;
  _local_280 = ZEXT1628(CONCAT412(fVar144,CONCAT48(fVar143,CONCAT44(fVar142,fVar138))));
  fVar23 = auVar47._0_4_;
  fVar167 = auVar48._0_4_;
  fVar155 = auVar47._4_4_;
  fVar176 = auVar48._4_4_;
  fVar168 = auVar47._8_4_;
  fVar178 = auVar48._8_4_;
  fVar179 = auVar47._12_4_;
  fVar180 = auVar48._12_4_;
  fVar56 = local_460._28_4_;
  auVar40._4_4_ = fVar193 * fVar176 * fVar155;
  auVar40._0_4_ = fVar188 * fVar167 * fVar23;
  auVar40._8_4_ = fVar194 * fVar178 * fVar168;
  auVar40._12_4_ = fVar195 * fVar180 * fVar179;
  auVar40._16_4_ = fVar196 * 0.0;
  auVar40._20_4_ = fVar197 * 0.0;
  auVar40._24_4_ = fVar198 * 0.0;
  auVar40._28_4_ = fVar56;
  auVar96 = vsubps_avx(ZEXT1632(CONCAT412(fVar144 * auVar49._12_4_,
                                          CONCAT48(fVar143 * auVar49._8_4_,
                                                   CONCAT44(fVar142 * auVar49._4_4_,
                                                            fVar138 * auVar49._0_4_)))),auVar40);
  auVar148 = ZEXT1632(auVar36);
  fVar145 = auVar50._0_4_;
  fVar115 = fVar145 * fVar2;
  fVar151 = auVar50._4_4_;
  fVar122 = fVar151 * fVar37;
  fVar152 = auVar50._8_4_;
  fVar124 = fVar152 * fVar4;
  fVar153 = auVar50._12_4_;
  fVar126 = fVar153 * fVar19;
  auVar41._28_4_ = fVar56;
  auVar41._0_28_ = ZEXT1628(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar115))));
  auVar200._0_4_ = fVar115 * fVar167 * fVar22 + auVar96._0_4_;
  auVar200._4_4_ = fVar122 * fVar176 * fVar154 + auVar96._4_4_;
  auVar200._8_4_ = fVar124 * fVar178 * fVar156 + auVar96._8_4_;
  auVar200._12_4_ = fVar126 * fVar180 * fVar177 + auVar96._12_4_;
  auVar200._16_4_ = fVar181 * 0.0 * 0.0 + auVar96._16_4_;
  auVar200._20_4_ = fVar182 * 0.0 * 0.0 + auVar96._20_4_;
  auVar200._24_4_ = fVar183 * 0.0 * 0.0 + auVar96._24_4_;
  auVar200._28_4_ = auVar96._28_4_ + 0.0;
  auVar43._4_4_ = fVar25 * fVar25;
  auVar43._0_4_ = fVar21 * fVar21;
  auVar43._8_4_ = fVar27 * fVar27;
  auVar43._12_4_ = fVar29 * fVar29;
  auVar43._16_4_ = fVar31 * fVar31;
  auVar43._20_4_ = fVar33 * fVar33;
  auVar43._24_4_ = fVar35 * fVar35;
  auVar43._28_4_ = auVar96._28_4_;
  auVar203 = _local_4c0;
  auVar36 = vfmadd231ps_fma(auVar43,_local_4c0,_local_4c0);
  auVar191 = _local_540;
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),_local_540,_local_540);
  auVar44._4_4_ = fVar193 * fVar155 * fVar155;
  auVar44._0_4_ = fVar188 * fVar23 * fVar23;
  auVar44._8_4_ = fVar194 * fVar168 * fVar168;
  auVar44._12_4_ = fVar195 * fVar179 * fVar179;
  auVar44._16_4_ = fVar196 * 0.0;
  auVar44._20_4_ = fVar197 * 0.0;
  auVar44._24_4_ = fVar198 * 0.0;
  auVar44._28_4_ = 0;
  auVar96 = vsubps_avx(ZEXT1632(CONCAT412(fVar144 * auVar36._12_4_,
                                          CONCAT48(fVar143 * auVar36._8_4_,
                                                   CONCAT44(fVar142 * auVar36._4_4_,
                                                            fVar138 * auVar36._0_4_)))),auVar44);
  auVar45._4_4_ = fVar155 * (fVar154 + fVar154);
  auVar45._0_4_ = fVar23 * (fVar22 + fVar22);
  auVar45._8_4_ = fVar168 * (fVar156 + fVar156);
  auVar45._12_4_ = fVar179 * (fVar177 + fVar177);
  auVar45._16_4_ = (fVar181 + fVar181) * 0.0;
  auVar45._20_4_ = (fVar182 + fVar182) * 0.0;
  auVar45._24_4_ = (fVar183 + fVar183) * 0.0;
  auVar45._28_4_ = auVar109._28_4_ + auVar109._28_4_;
  auVar109 = vsubps_avx(auVar45,auVar41);
  fVar100 = fVar167 * fVar167;
  fVar111 = fVar176 * fVar176;
  fVar112 = fVar178 * fVar178;
  fVar113 = fVar180 * fVar180;
  auVar46._4_4_ = fVar193 * fVar111;
  auVar46._0_4_ = fVar188 * fVar100;
  auVar46._8_4_ = fVar194 * fVar112;
  auVar46._12_4_ = fVar195 * fVar113;
  auVar46._16_4_ = fVar196 * 0.0;
  auVar46._20_4_ = fVar197 * 0.0;
  auVar46._24_4_ = fVar198 * 0.0;
  auVar46._28_4_ = fVar56;
  auVar119 = vsubps_avx(_local_280,auVar46);
  auVar57._4_4_ = auVar119._4_4_ * (auVar96._4_4_ + fVar122 * auVar109._4_4_);
  auVar57._0_4_ = auVar119._0_4_ * (auVar96._0_4_ + fVar115 * auVar109._0_4_);
  auVar57._8_4_ = auVar119._8_4_ * (auVar96._8_4_ + fVar124 * auVar109._8_4_);
  auVar57._12_4_ = auVar119._12_4_ * (auVar96._12_4_ + fVar126 * auVar109._12_4_);
  auVar57._16_4_ = auVar119._16_4_ * (auVar96._16_4_ + auVar109._16_4_ * 0.0);
  auVar57._20_4_ = auVar119._20_4_ * (auVar96._20_4_ + auVar109._20_4_ * 0.0);
  auVar57._24_4_ = auVar119._24_4_ * (auVar96._24_4_ + auVar109._24_4_ * 0.0);
  auVar57._28_4_ = auVar96._28_4_ + fVar56;
  auVar58._4_4_ = auVar200._4_4_ * auVar200._4_4_;
  auVar58._0_4_ = auVar200._0_4_ * auVar200._0_4_;
  auVar58._8_4_ = auVar200._8_4_ * auVar200._8_4_;
  auVar58._12_4_ = auVar200._12_4_ * auVar200._12_4_;
  auVar58._16_4_ = auVar200._16_4_ * auVar200._16_4_;
  auVar58._20_4_ = auVar200._20_4_ * auVar200._20_4_;
  auVar58._24_4_ = auVar200._24_4_ * auVar200._24_4_;
  auVar58._28_4_ = auVar109._28_4_;
  auVar96 = vsubps_avx(auVar58,auVar57);
  auVar141 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar109 = vcmpps_avx(auVar96,auVar141,5);
  auVar164 = auVar109 & ~auVar101;
  if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar164 >> 0x7f,0) != '\0') ||
        (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar164 >> 0xbf,0) != '\0') ||
      (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar164[0x1f] < '\0')
  {
    auVar109 = vandnps_avx(auVar101,auVar109);
    auVar36 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
    auVar108 = vsubps_avx(auVar131,ZEXT1632(auVar51));
    auVar38 = vsubps_avx(auVar103,ZEXT1632(auVar52));
    auVar101 = vsubps_avx(auVar140,ZEXT1632(auVar53));
    auVar104._2_2_ = 0;
    auVar104._0_2_ = uVar7;
    auVar96 = vsqrtps_avx(auVar96);
    auVar104._4_2_ = uVar7;
    auVar104._6_2_ = 0;
    auVar104._8_2_ = uVar7;
    auVar104._10_2_ = 0;
    auVar104._12_2_ = uVar7;
    auVar104._14_2_ = 0;
    auVar104._16_2_ = uVar7;
    auVar104._18_2_ = 0;
    auVar104._20_2_ = uVar7;
    auVar104._22_2_ = 0;
    auVar104._24_2_ = uVar7;
    auVar104._26_2_ = 0;
    auVar104._28_2_ = uVar7;
    auVar104._30_2_ = 0;
    auVar109 = vrcpps_avx(auVar119);
    auVar91._8_4_ = 0x3f800000;
    auVar91._0_8_ = &DAT_3f8000003f800000;
    auVar91._12_4_ = 0x3f800000;
    auVar91._16_4_ = 0x3f800000;
    auVar91._20_4_ = 0x3f800000;
    auVar91._24_4_ = 0x3f800000;
    auVar91._28_4_ = 0x3f800000;
    auVar47 = vfnmadd213ps_fma(auVar109,auVar119,auVar91);
    auVar201._8_4_ = 0x7fffffff;
    auVar201._0_8_ = 0x7fffffff7fffffff;
    auVar201._12_4_ = 0x7fffffff;
    auVar201._16_4_ = 0x7fffffff;
    auVar201._20_4_ = 0x7fffffff;
    auVar201._24_4_ = 0x7fffffff;
    auVar201._28_4_ = 0x7fffffff;
    auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar109,auVar109);
    auVar109 = vandps_avx(auVar201,auVar119);
    auVar160._8_4_ = 0x219392ef;
    auVar160._0_8_ = 0x219392ef219392ef;
    auVar160._12_4_ = 0x219392ef;
    auVar160._16_4_ = 0x219392ef;
    auVar160._20_4_ = 0x219392ef;
    auVar160._24_4_ = 0x219392ef;
    auVar160._28_4_ = 0x219392ef;
    auVar109 = vcmpps_avx(auVar109,auVar160,2);
    uVar88 = CONCAT44(auVar200._4_4_,auVar200._0_4_);
    auVar117._0_8_ = uVar88 ^ 0x8000000080000000;
    auVar117._8_4_ = -auVar200._8_4_;
    auVar117._12_4_ = -auVar200._12_4_;
    auVar117._16_4_ = -auVar200._16_4_;
    auVar117._20_4_ = -auVar200._20_4_;
    auVar117._24_4_ = -auVar200._24_4_;
    auVar117._28_4_ = -auVar200._28_4_;
    auVar119 = vsubps_avx(auVar117,auVar96);
    auVar164 = vsubps_avx(auVar96,auVar200);
    auVar92._8_4_ = 0xff800000;
    auVar92._0_8_ = 0xff800000ff800000;
    auVar92._12_4_ = 0xff800000;
    auVar92._16_4_ = 0xff800000;
    auVar92._20_4_ = 0xff800000;
    auVar92._24_4_ = 0xff800000;
    auVar92._28_4_ = 0xff800000;
    auVar59._4_4_ = auVar47._4_4_ * auVar119._4_4_;
    auVar59._0_4_ = auVar47._0_4_ * auVar119._0_4_;
    auVar59._8_4_ = auVar47._8_4_ * auVar119._8_4_;
    auVar59._12_4_ = auVar47._12_4_ * auVar119._12_4_;
    auVar59._16_4_ = auVar119._16_4_ * 0.0;
    auVar59._20_4_ = auVar119._20_4_ * 0.0;
    auVar59._24_4_ = auVar119._24_4_ * 0.0;
    auVar59._28_4_ = auVar119._28_4_;
    auVar96 = vblendvps_avx(auVar59,auVar92,auVar109);
    auVar60._4_4_ = auVar47._4_4_ * auVar164._4_4_;
    auVar60._0_4_ = auVar47._0_4_ * auVar164._0_4_;
    auVar60._8_4_ = auVar47._8_4_ * auVar164._8_4_;
    auVar60._12_4_ = auVar47._12_4_ * auVar164._12_4_;
    auVar60._16_4_ = auVar164._16_4_ * 0.0;
    auVar60._20_4_ = auVar164._20_4_ * 0.0;
    auVar60._24_4_ = auVar164._24_4_ * 0.0;
    auVar60._28_4_ = auVar164._28_4_;
    auVar93._8_4_ = 0x7f800000;
    auVar93._0_8_ = 0x7f8000007f800000;
    auVar93._12_4_ = 0x7f800000;
    auVar93._16_4_ = 0x7f800000;
    auVar93._20_4_ = 0x7f800000;
    auVar93._24_4_ = 0x7f800000;
    auVar93._28_4_ = 0x7f800000;
    auVar119 = vblendvps_avx(auVar60,auVar93,auVar109);
    auVar109 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar39 = vpand_avx2(auVar109,auVar104);
    auVar202._2_2_ = 0;
    auVar202._0_2_ = uVar6;
    auVar202._4_2_ = uVar6;
    auVar202._6_2_ = 0;
    auVar202._8_2_ = uVar6;
    auVar202._10_2_ = 0;
    auVar202._12_2_ = uVar6;
    auVar202._14_2_ = 0;
    auVar202._16_2_ = uVar6;
    auVar202._18_2_ = 0;
    auVar202._20_2_ = uVar6;
    auVar202._22_2_ = 0;
    auVar202._24_2_ = uVar6;
    auVar202._26_2_ = 0;
    auVar202._28_2_ = uVar6;
    auVar202._30_2_ = 0;
    auVar40 = vpand_avx2(auVar202,auVar109);
    auVar132._0_4_ = fVar23 + fVar167 * auVar96._0_4_;
    auVar132._4_4_ = fVar155 + fVar176 * auVar96._4_4_;
    auVar132._8_4_ = fVar168 + fVar178 * auVar96._8_4_;
    auVar132._12_4_ = fVar179 + fVar180 * auVar96._12_4_;
    auVar132._16_4_ = auVar96._16_4_ * 0.0 + 0.0;
    auVar132._20_4_ = auVar96._20_4_ * 0.0 + 0.0;
    auVar132._24_4_ = auVar96._24_4_ * 0.0 + 0.0;
    auVar132._28_4_ = auVar109._28_4_ + 0.0;
    auVar109 = vcmpps_avx(auVar132,auVar141,6);
    auVar164 = vcmpps_avx(auVar132,auVar148,1);
    auVar109 = vandps_avx(auVar164,auVar109);
    auVar47 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
    auVar47 = vpand_avx(auVar36,auVar47);
    auVar109 = vpmovsxwd_avx2(auVar47);
    local_240 = vblendvps_avx(auVar93,auVar96,auVar109);
    local_80._0_4_ = fVar23 + fVar167 * auVar119._0_4_;
    local_80._4_4_ = fVar155 + fVar176 * auVar119._4_4_;
    fStack_78 = fVar168 + fVar178 * auVar119._8_4_;
    fStack_74 = fVar179 + fVar180 * auVar119._12_4_;
    fStack_70 = auVar119._16_4_ * 0.0 + 0.0;
    fStack_6c = auVar119._20_4_ * 0.0 + 0.0;
    fStack_68 = auVar119._24_4_ * 0.0 + 0.0;
    register0x000015dc = auVar109._28_4_ + 0.0;
    auVar141 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar109 = vcmpps_avx(_local_80,auVar141,6);
    auVar96 = vcmpps_avx(_local_80,auVar148,1);
    auVar109 = vandps_avx(auVar96,auVar109);
    auVar47 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
    auVar47 = vpand_avx(auVar36,auVar47);
    auVar109 = vpmovsxwd_avx2(auVar47);
    local_580 = vblendvps_avx(auVar92,auVar119,auVar109);
    auVar164 = vpcmpeqd_avx2(auVar39,auVar141);
    auVar141 = vpcmpeqd_avx2(auVar40,auVar141);
    auVar109 = vrcpps_avx(ZEXT1632(auVar48));
    auVar105._8_4_ = 0x3f800000;
    auVar105._0_8_ = &DAT_3f8000003f800000;
    auVar105._12_4_ = 0x3f800000;
    auVar105._16_4_ = 0x3f800000;
    auVar105._20_4_ = 0x3f800000;
    auVar105._24_4_ = 0x3f800000;
    auVar105._28_4_ = 0x3f800000;
    auVar47 = vfnmadd213ps_fma(auVar109,ZEXT1632(auVar48),auVar105);
    auVar48 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar109,auVar109);
    auVar61._4_4_ = fVar176 * (float)local_540._4_4_;
    auVar61._0_4_ = fVar167 * (float)local_540._0_4_;
    auVar61._8_4_ = fVar178 * fStack_538;
    auVar61._12_4_ = fVar180 * fStack_534;
    auVar61._16_4_ = (float)uStack_530 * 0.0;
    auVar61._20_4_ = uStack_530._4_4_ * 0.0;
    auVar61._24_4_ = (float)uStack_528 * 0.0;
    auVar61._28_4_ = auVar109._28_4_;
    auVar133._0_4_ = fVar5 * fVar23;
    auVar133._4_4_ = fVar5 * fVar155;
    auVar133._8_4_ = fVar5 * fVar168;
    auVar133._12_4_ = fVar5 * fVar179;
    auVar133._16_4_ = fVar5 * 0.0;
    auVar133._20_4_ = fVar5 * 0.0;
    auVar133._24_4_ = fVar5 * 0.0;
    auVar133._28_4_ = 0;
    auVar109 = vsubps_avx(auVar61,auVar133);
    auVar62._4_4_ = fVar176 * (float)local_4c0._4_4_;
    auVar62._0_4_ = fVar167 * (float)local_4c0._0_4_;
    auVar62._8_4_ = fVar178 * fStack_4b8;
    auVar62._12_4_ = fVar180 * fStack_4b4;
    auVar62._16_4_ = fStack_4b0 * 0.0;
    auVar62._20_4_ = fStack_4ac * 0.0;
    auVar62._24_4_ = fStack_4a8 * 0.0;
    auVar62._28_4_ = 0;
    auVar63._4_4_ = fVar3 * fVar155;
    auVar63._0_4_ = fVar3 * fVar23;
    auVar63._8_4_ = fVar3 * fVar168;
    auVar63._12_4_ = fVar3 * fVar179;
    auVar63._16_4_ = fVar3 * 0.0;
    auVar63._20_4_ = fVar3 * 0.0;
    auVar63._24_4_ = fVar3 * 0.0;
    auVar63._28_4_ = auVar119._28_4_;
    auVar96 = vsubps_avx(auVar62,auVar63);
    auVar64._4_4_ = fVar176 * fVar25;
    auVar64._0_4_ = fVar167 * fVar21;
    auVar64._8_4_ = fVar178 * fVar27;
    auVar64._12_4_ = fVar180 * fVar29;
    auVar64._16_4_ = fVar31 * 0.0;
    auVar64._20_4_ = fVar33 * 0.0;
    auVar64._24_4_ = fVar35 * 0.0;
    auVar64._28_4_ = auVar119._28_4_;
    auVar65._4_4_ = fVar155 * local_400;
    auVar65._0_4_ = fVar23 * local_400;
    auVar65._8_4_ = fVar168 * local_400;
    auVar65._12_4_ = fVar179 * local_400;
    auVar65._16_4_ = local_400 * 0.0;
    auVar65._20_4_ = local_400 * 0.0;
    auVar65._24_4_ = local_400 * 0.0;
    auVar65._28_4_ = auVar40._28_4_;
    auVar119 = vsubps_avx(auVar64,auVar65);
    auVar66._4_4_ = auVar119._4_4_ * auVar119._4_4_;
    auVar66._0_4_ = auVar119._0_4_ * auVar119._0_4_;
    auVar66._8_4_ = auVar119._8_4_ * auVar119._8_4_;
    auVar66._12_4_ = auVar119._12_4_ * auVar119._12_4_;
    auVar66._16_4_ = auVar119._16_4_ * auVar119._16_4_;
    auVar66._20_4_ = auVar119._20_4_ * auVar119._20_4_;
    auVar66._24_4_ = auVar119._24_4_ * auVar119._24_4_;
    auVar66._28_4_ = auVar119._28_4_;
    auVar47 = vfmadd231ps_fma(auVar66,auVar96,auVar96);
    auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar109,auVar109);
    auVar109 = vcmpps_avx(ZEXT1632(auVar47),
                          ZEXT1632(CONCAT412(fVar113 * fVar153 * fVar153,
                                             CONCAT48(fVar112 * fVar152 * fVar152,
                                                      CONCAT44(fVar111 * fVar151 * fVar151,
                                                               fVar100 * fVar145 * fVar145)))),1);
    auVar109 = vandps_avx(auVar109,auVar141);
    auVar47 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
    auVar67._4_4_ = auVar48._4_4_ * -fVar155;
    auVar67._0_4_ = auVar48._0_4_ * -fVar23;
    auVar67._8_4_ = auVar48._8_4_ * -fVar168;
    auVar67._12_4_ = auVar48._12_4_ * -fVar179;
    auVar67._16_4_ = 0x80000000;
    auVar67._20_4_ = 0x80000000;
    auVar67._24_4_ = 0x80000000;
    auVar67._28_4_ = 0x80000000;
    auVar47 = vpand_avx(auVar36,auVar47);
    auVar109 = vpmovsxwd_avx2(auVar47);
    auVar134._8_4_ = 0x7f800000;
    auVar134._0_8_ = 0x7f8000007f800000;
    auVar134._12_4_ = 0x7f800000;
    auVar134._16_4_ = 0x7f800000;
    auVar134._20_4_ = 0x7f800000;
    auVar134._24_4_ = 0x7f800000;
    auVar134._28_4_ = 0x7f800000;
    local_260 = vblendvps_avx(auVar134,auVar67,auVar109);
    local_3a0._0_4_ = auVar101._0_4_;
    local_3a0._4_4_ = auVar101._4_4_;
    fStack_398 = auVar101._8_4_;
    fStack_394 = auVar101._12_4_;
    fStack_390 = auVar101._16_4_;
    fStack_38c = auVar101._20_4_;
    fStack_388 = auVar101._24_4_;
    uStack_384 = auVar101._28_4_;
    auVar68._4_4_ = (float)local_3a0._4_4_ * fVar24;
    auVar68._0_4_ = (float)local_3a0._0_4_ * fVar20;
    auVar68._8_4_ = fStack_398 * fVar26;
    auVar68._12_4_ = fStack_394 * fVar28;
    auVar68._16_4_ = fStack_390 * fVar30;
    auVar68._20_4_ = fStack_38c * fVar32;
    auVar68._24_4_ = fStack_388 * fVar34;
    auVar68._28_4_ = 0x80000000;
    auVar47 = vfmadd231ps_fma(auVar68,auVar38,local_460);
    auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar108,local_440);
    auVar69._4_4_ = fVar176 * auVar108._4_4_;
    auVar69._0_4_ = fVar167 * auVar108._0_4_;
    auVar69._8_4_ = fVar178 * auVar108._8_4_;
    auVar69._12_4_ = fVar180 * auVar108._12_4_;
    auVar69._16_4_ = auVar108._16_4_ * 0.0;
    auVar69._20_4_ = auVar108._20_4_ * 0.0;
    auVar69._24_4_ = auVar108._24_4_ * 0.0;
    auVar69._28_4_ = auVar108._28_4_;
    auVar70._4_4_ = fVar176 * auVar38._4_4_;
    auVar70._0_4_ = fVar167 * auVar38._0_4_;
    auVar70._8_4_ = fVar178 * auVar38._8_4_;
    auVar70._12_4_ = fVar180 * auVar38._12_4_;
    auVar70._16_4_ = auVar38._16_4_ * 0.0;
    auVar70._20_4_ = auVar38._20_4_ * 0.0;
    auVar70._24_4_ = auVar38._24_4_ * 0.0;
    auVar70._28_4_ = auVar38._28_4_;
    auVar71._4_4_ = fVar176 * (float)local_3a0._4_4_;
    auVar71._0_4_ = fVar167 * (float)local_3a0._0_4_;
    auVar71._8_4_ = fVar178 * fStack_398;
    auVar71._12_4_ = fVar180 * fStack_394;
    auVar71._16_4_ = fStack_390 * 0.0;
    auVar71._20_4_ = fStack_38c * 0.0;
    auVar71._24_4_ = fStack_388 * 0.0;
    auVar71._28_4_ = uStack_384;
    fVar23 = auVar47._0_4_;
    auVar173._0_4_ = fVar5 * fVar23;
    fVar155 = auVar47._4_4_;
    auVar173._4_4_ = fVar5 * fVar155;
    fVar168 = auVar47._8_4_;
    auVar173._8_4_ = fVar5 * fVar168;
    fVar179 = auVar47._12_4_;
    auVar173._12_4_ = fVar5 * fVar179;
    auVar173._16_4_ = fVar5 * 0.0;
    auVar173._20_4_ = fVar5 * 0.0;
    auVar173._24_4_ = fVar5 * 0.0;
    auVar173._28_4_ = 0;
    auVar109 = vsubps_avx(auVar69,auVar173);
    auVar72._4_4_ = fVar3 * fVar155;
    auVar72._0_4_ = fVar3 * fVar23;
    auVar72._8_4_ = fVar3 * fVar168;
    auVar72._12_4_ = fVar3 * fVar179;
    auVar72._16_4_ = fVar3 * 0.0;
    auVar72._20_4_ = fVar3 * 0.0;
    auVar72._24_4_ = fVar3 * 0.0;
    auVar72._28_4_ = 0;
    auVar96 = vsubps_avx(auVar70,auVar72);
    auVar73._4_4_ = local_400 * fVar155;
    auVar73._0_4_ = local_400 * fVar23;
    auVar73._8_4_ = local_400 * fVar168;
    auVar73._12_4_ = local_400 * fVar179;
    auVar73._16_4_ = local_400 * 0.0;
    auVar73._20_4_ = local_400 * 0.0;
    auVar73._24_4_ = local_400 * 0.0;
    auVar73._28_4_ = 0;
    auVar119 = vsubps_avx(auVar71,auVar73);
    auVar74._4_4_ = auVar119._4_4_ * auVar119._4_4_;
    auVar74._0_4_ = auVar119._0_4_ * auVar119._0_4_;
    auVar74._8_4_ = auVar119._8_4_ * auVar119._8_4_;
    auVar74._12_4_ = auVar119._12_4_ * auVar119._12_4_;
    auVar74._16_4_ = auVar119._16_4_ * auVar119._16_4_;
    auVar74._20_4_ = auVar119._20_4_ * auVar119._20_4_;
    auVar74._24_4_ = auVar119._24_4_ * auVar119._24_4_;
    auVar74._28_4_ = auVar119._28_4_;
    auVar47 = vfmadd231ps_fma(auVar74,auVar96,auVar96);
    auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar109,auVar109);
    local_5a0._0_4_ = auVar54._0_4_;
    local_5a0._4_4_ = auVar54._4_4_;
    fStack_598 = auVar54._8_4_;
    fStack_594 = auVar54._12_4_;
    auVar75._28_4_ = auVar96._28_4_;
    auVar75._0_28_ =
         ZEXT1628(CONCAT412(fVar113 * fStack_594 * fStack_594,
                            CONCAT48(fVar112 * fStack_598 * fStack_598,
                                     CONCAT44(fVar111 * (float)local_5a0._4_4_ *
                                                        (float)local_5a0._4_4_,
                                              fVar100 * (float)local_5a0._0_4_ *
                                                        (float)local_5a0._0_4_))));
    auVar174._8_4_ = 0x7f800000;
    auVar174._0_8_ = 0x7f8000007f800000;
    auVar174._12_4_ = 0x7f800000;
    auVar174._16_4_ = 0x7f800000;
    auVar174._20_4_ = 0x7f800000;
    auVar174._24_4_ = 0x7f800000;
    auVar174._28_4_ = 0x7f800000;
    uVar127 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar94._4_4_ = uVar127;
    auVar94._0_4_ = uVar127;
    auVar94._8_4_ = uVar127;
    auVar94._12_4_ = uVar127;
    auVar94._16_4_ = uVar127;
    auVar94._20_4_ = uVar127;
    auVar94._24_4_ = uVar127;
    auVar94._28_4_ = uVar127;
    auVar109 = vcmpps_avx(ZEXT1632(auVar47),auVar75,1);
    auVar109 = vandps_avx(auVar109,auVar164);
    auVar76._4_4_ = auVar48._4_4_ * -fVar155;
    auVar76._0_4_ = auVar48._0_4_ * -fVar23;
    auVar76._8_4_ = auVar48._8_4_ * -fVar168;
    auVar76._12_4_ = auVar48._12_4_ * -fVar179;
    auVar76._16_4_ = 0x80000000;
    auVar76._20_4_ = 0x80000000;
    auVar76._24_4_ = 0x80000000;
    auVar76._28_4_ = 0x80000000;
    auVar47 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
    auVar47 = vpand_avx(auVar36,auVar47);
    auVar109 = vpmovsxwd_avx2(auVar47);
    auVar109 = vblendvps_avx(auVar174,auVar76,auVar109);
    auVar164 = vminps_avx(local_260,auVar109);
    auVar96 = vmaxps_avx(local_260,auVar109);
    auVar101 = vminps_avx(local_240,auVar164);
    auVar119 = vcmpps_avx(auVar101,auVar164,0);
    auVar109 = vcmpps_avx(auVar174,auVar96,0);
    auVar161._8_4_ = 0xff800000;
    auVar161._0_8_ = 0xff800000ff800000;
    auVar161._12_4_ = 0xff800000;
    auVar161._16_4_ = 0xff800000;
    auVar161._20_4_ = 0xff800000;
    auVar161._24_4_ = 0xff800000;
    auVar161._28_4_ = 0xff800000;
    auVar109 = vblendvps_avx(auVar96,auVar161,auVar109);
    auVar96 = vcmpps_avx(auVar174,auVar164,0);
    auVar96 = vblendvps_avx(auVar164,auVar161,auVar96);
    auVar109 = vblendvps_avx(auVar96,auVar109,auVar119);
    local_a0 = vmaxps_avx(local_580,auVar109);
    auVar118._0_4_ = fVar114 + auVar101._0_4_;
    auVar118._4_4_ = fVar121 + auVar101._4_4_;
    auVar118._8_4_ = fVar123 + auVar101._8_4_;
    auVar118._12_4_ = fVar125 + auVar101._12_4_;
    auVar118._16_4_ = auVar101._16_4_ + 0.0;
    auVar118._20_4_ = auVar101._20_4_ + 0.0;
    auVar118._24_4_ = auVar101._24_4_ + 0.0;
    auVar118._28_4_ = fStack_4c4 + auVar101._28_4_;
    fVar23 = (ray->super_RayK<1>).tfar;
    auVar135._4_4_ = fVar23;
    auVar135._0_4_ = fVar23;
    auVar135._8_4_ = fVar23;
    auVar135._12_4_ = fVar23;
    auVar135._16_4_ = fVar23;
    auVar135._20_4_ = fVar23;
    auVar135._24_4_ = fVar23;
    auVar135._28_4_ = fVar23;
    auVar109 = vcmpps_avx(auVar94,auVar118,2);
    auVar96 = vcmpps_avx(auVar118,auVar135,2);
    auVar109 = vandps_avx(auVar109,auVar96);
    auVar96 = vcmpps_avx(auVar174,auVar101,4);
    auVar109 = vandps_avx(auVar109,auVar96);
    auVar47 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
    local_360 = vpand_avx(auVar36,auVar47);
    local_5a0._0_4_ = fVar114 + local_a0._0_4_;
    local_5a0._4_4_ = fVar121 + local_a0._4_4_;
    fStack_598 = fVar123 + local_a0._8_4_;
    fStack_594 = fVar125 + local_a0._12_4_;
    register0x00001290 = local_a0._16_4_ + 0.0;
    register0x00001294 = local_a0._20_4_ + 0.0;
    register0x00001298 = local_a0._24_4_ + 0.0;
    register0x0000129c = fStack_4c4 + local_a0._28_4_;
    auVar109 = vcmpps_avx(auVar94,_local_5a0,2);
    auVar96 = vcmpps_avx(_local_5a0,auVar135,2);
    auVar109 = vandps_avx(auVar109,auVar96);
    auVar96 = vcmpps_avx(local_a0,auVar161,4);
    auVar109 = vandps_avx(auVar109,auVar96);
    auVar47 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
    local_380 = vpand_avx(auVar36,auVar47);
    auVar47 = vpor_avx(local_360,local_380);
    auVar109 = vpmovsxwd_avx2(auVar47);
    if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar109 >> 0x7f,0) != '\0') ||
          (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar109 >> 0xbf,0) != '\0') ||
        (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar109[0x1f] < '\0') {
      auStack_370 = auVar38._16_16_;
      auStack_350 = auVar108._16_16_;
      _local_3a0 = auVar109;
      auVar96 = vpmovzxwd_avx2(local_360);
      auVar119 = vpslld_avx2(auVar96,0x1f);
      auVar96 = vblendvps_avx(local_a0,auVar101,auVar119);
      auVar119 = vblendvps_avx(_local_80,auVar132,auVar119);
      auVar141 = vrcpps_avx(auVar148);
      auVar206._8_4_ = 0x3f800000;
      auVar206._0_8_ = &DAT_3f8000003f800000;
      auVar206._12_4_ = 0x3f800000;
      auVar206._16_4_ = 0x3f800000;
      auVar206._20_4_ = 0x3f800000;
      auVar206._24_4_ = 0x3f800000;
      auVar206._28_4_ = 0x3f800000;
      auVar49 = vfnmadd213ps_fma(auVar141,auVar148,auVar206);
      fVar145 = fVar2 * fVar22 * fVar145;
      fVar151 = fVar37 * fVar154 * fVar151;
      fVar152 = fVar4 * fVar156 * fVar152;
      fVar153 = fVar19 * fVar177 * fVar153;
      fVar154 = fVar181 * 0.0 * 0.0;
      fVar155 = fVar182 * 0.0 * 0.0;
      fVar156 = fVar183 * 0.0 * 0.0;
      local_c0 = local_440._0_4_ * fVar145;
      fStack_bc = local_440._4_4_ * fVar151;
      fVar111 = local_440._8_4_;
      fVar112 = local_440._12_4_;
      fVar113 = local_440._16_4_;
      fVar115 = local_440._20_4_;
      fVar122 = local_440._24_4_;
      local_e0 = local_440._0_4_ * fVar188;
      fStack_dc = local_440._4_4_ * fVar193;
      auVar164 = vcmpps_avx(auVar96,local_240,0);
      auVar101 = vcmpps_avx(auVar96,local_580,0);
      auVar164 = vorps_avx(auVar164,auVar101);
      auVar48 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
      auVar48 = vpand_avx(auVar36,auVar48);
      auVar148 = vpmovsxwd_avx2(auVar48);
      auVar164 = vcmpps_avx(auVar96,local_260,0);
      auVar48 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
      auVar36 = vpand_avx(auVar36,auVar48);
      auVar108 = vpmovsxwd_avx2(auVar36);
      fVar168 = auVar96._0_4_;
      fVar177 = auVar96._4_4_;
      fVar179 = auVar96._8_4_;
      fVar181 = auVar96._12_4_;
      fVar182 = auVar96._16_4_;
      fVar183 = auVar96._20_4_;
      fVar100 = auVar96._24_4_;
      fStack_b8 = fVar111 * fVar152;
      fStack_b4 = fVar112 * fVar153;
      fStack_b0 = fVar113 * fVar154;
      fStack_ac = fVar115 * fVar155;
      fStack_a8 = fVar122 * fVar156;
      fStack_a4 = fStack_4c4;
      auVar136._0_4_ = local_c0 + fVar138 * (fVar168 * fVar5 + (float)local_540._0_4_);
      auVar136._4_4_ = fStack_bc + fVar142 * (fVar177 * fVar5 + (float)local_540._4_4_);
      auVar136._8_4_ = fVar111 * fVar152 + fVar143 * (fVar179 * fVar5 + fStack_538);
      auVar136._12_4_ = fVar112 * fVar153 + fVar144 * (fVar181 * fVar5 + fStack_534);
      auVar136._16_4_ = fVar113 * fVar154 + (fVar182 * fVar5 + (float)uStack_530) * 0.0;
      auVar136._20_4_ = fVar115 * fVar155 + (fVar183 * fVar5 + uStack_530._4_4_) * 0.0;
      auVar136._24_4_ = fVar122 * fVar156 + (fVar100 * fVar5 + (float)uStack_528) * 0.0;
      auVar136._28_4_ = fStack_4c4 + uStack_528._4_4_ + 0.0;
      fStack_d8 = fVar111 * fVar194;
      fStack_d4 = fVar112 * fVar195;
      fStack_d0 = fVar113 * fVar196;
      fStack_cc = fVar115 * fVar197;
      fStack_c8 = fVar122 * fVar198;
      uStack_c4 = 0x80000000;
      fVar2 = auVar119._0_4_;
      auVar186._0_4_ = local_e0 * fVar2;
      fVar37 = auVar119._4_4_;
      auVar186._4_4_ = fStack_dc * fVar37;
      fVar4 = auVar119._8_4_;
      auVar186._8_4_ = fVar111 * fVar194 * fVar4;
      fVar5 = auVar119._12_4_;
      auVar186._12_4_ = fVar112 * fVar195 * fVar5;
      fVar19 = auVar119._16_4_;
      auVar186._16_4_ = fVar113 * fVar196 * fVar19;
      fVar22 = auVar119._20_4_;
      auVar186._20_4_ = fVar115 * fVar197 * fVar22;
      fVar23 = auVar119._24_4_;
      auVar186._24_4_ = fVar122 * fVar198 * fVar23;
      auVar186._28_4_ = 0;
      auVar101 = vsubps_avx(auVar136,auVar186);
      local_160._0_8_ = local_440._0_8_ ^ 0x8000000080000000;
      local_160._8_4_ = -fVar111;
      local_160._12_4_ = -fVar112;
      local_160._16_4_ = -fVar113;
      local_160._20_4_ = -fVar115;
      local_160._24_4_ = -fVar122;
      local_160._28_4_ = local_440._28_4_ ^ 0x80000000;
      auVar164 = vblendvps_avx(local_440,local_160,auVar108);
      local_3c0 = vblendvps_avx(auVar164,auVar101,auVar148);
      auVar36 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar141,auVar141);
      local_120 = local_460._0_4_ * fVar145;
      fStack_11c = local_460._4_4_ * fVar151;
      fVar111 = local_460._8_4_;
      fVar112 = local_460._12_4_;
      fVar113 = local_460._16_4_;
      fVar115 = local_460._20_4_;
      fStack_104 = auVar141._28_4_;
      fVar122 = local_460._24_4_;
      fStack_118 = fVar111 * fVar152;
      fStack_114 = fVar112 * fVar153;
      fStack_110 = fVar113 * fVar154;
      fStack_10c = fVar115 * fVar155;
      fStack_108 = fVar122 * fVar156;
      auVar137._0_4_ = local_120 + fVar138 * (fVar168 * fVar3 + (float)local_4c0._0_4_);
      auVar137._4_4_ = fStack_11c + fVar142 * (fVar177 * fVar3 + (float)local_4c0._4_4_);
      auVar137._8_4_ = fVar111 * fVar152 + fVar143 * (fVar179 * fVar3 + fStack_4b8);
      auVar137._12_4_ = fVar112 * fVar153 + fVar144 * (fVar181 * fVar3 + fStack_4b4);
      auVar137._16_4_ = fVar113 * fVar154 + (fVar182 * fVar3 + fStack_4b0) * 0.0;
      auVar137._20_4_ = fVar115 * fVar155 + (fVar183 * fVar3 + fStack_4ac) * 0.0;
      auVar137._24_4_ = fVar122 * fVar156 + (fVar100 * fVar3 + fStack_4a8) * 0.0;
      auVar137._28_4_ = fStack_104 + auVar101._28_4_ + fStack_4a4;
      local_100 = local_460._0_4_ * fVar188;
      fStack_fc = local_460._4_4_ * fVar193;
      fStack_f8 = fVar111 * fVar194;
      fStack_f4 = fVar112 * fVar195;
      fStack_f0 = fVar113 * fVar196;
      fStack_ec = fVar115 * fVar197;
      fStack_e8 = fVar122 * fVar198;
      fStack_e4 = fStack_104;
      auVar77._4_4_ = fStack_fc * fVar37;
      auVar77._0_4_ = local_100 * fVar2;
      auVar77._8_4_ = fVar111 * fVar194 * fVar4;
      auVar77._12_4_ = fVar112 * fVar195 * fVar5;
      auVar77._16_4_ = fVar113 * fVar196 * fVar19;
      auVar77._20_4_ = fVar115 * fVar197 * fVar22;
      auVar77._24_4_ = fVar122 * fVar198 * fVar23;
      auVar77._28_4_ = fStack_104;
      auVar101 = vsubps_avx(auVar137,auVar77);
      local_1c0._0_8_ = local_460._0_8_ ^ 0x8000000080000000;
      local_1c0._8_4_ = -fVar111;
      local_1c0._12_4_ = -fVar112;
      local_1c0._16_4_ = -fVar113;
      local_1c0._20_4_ = -fVar115;
      local_1c0._24_4_ = -fVar122;
      local_1c0._28_4_ = -fVar56;
      auVar164 = vblendvps_avx(local_460,local_1c0,auVar108);
      local_3e0 = vblendvps_avx(auVar164,auVar101,auVar148);
      auVar209 = ZEXT3264(local_480);
      local_180 = fVar20 * fVar145;
      fStack_17c = fVar24 * fVar151;
      fStack_178 = fVar26 * fVar152;
      fStack_174 = fVar28 * fVar153;
      fStack_170 = fVar30 * fVar154;
      fStack_16c = fVar32 * fVar155;
      fStack_168 = fVar34 * fVar156;
      fStack_164 = local_3e0._28_4_;
      auVar149._0_4_ = fVar20 * fVar145 + fVar138 * (fVar21 + fVar168 * local_400);
      auVar149._4_4_ = fVar24 * fVar151 + fVar142 * (fVar25 + fVar177 * local_400);
      auVar149._8_4_ = fVar26 * fVar152 + fVar143 * (fVar27 + fVar179 * local_400);
      auVar149._12_4_ = fVar28 * fVar153 + fVar144 * (fVar29 + fVar181 * local_400);
      auVar149._16_4_ = fVar30 * fVar154 + (fVar31 + fVar182 * local_400) * 0.0;
      auVar149._20_4_ = fVar32 * fVar155 + (fVar33 + fVar183 * local_400) * 0.0;
      auVar149._24_4_ = fVar34 * fVar156 + (fVar35 + fVar100 * local_400) * 0.0;
      auVar149._28_4_ = local_3e0._28_4_ + local_420._28_4_ + 0.0;
      local_1e0._0_8_ = local_480._0_8_ ^ 0x8000000080000000;
      local_1e0._8_4_ = -fVar26;
      local_1e0._12_4_ = -fVar28;
      local_1e0._16_4_ = -fVar30;
      local_1e0._20_4_ = -fVar32;
      local_1e0._24_4_ = -fVar34;
      local_1e0._28_4_ = local_480._28_4_ ^ 0x80000000;
      local_140 = fVar20 * fVar188;
      fStack_13c = fVar24 * fVar193;
      fStack_138 = fVar26 * fVar194;
      fStack_134 = fVar28 * fVar195;
      fStack_130 = fVar30 * fVar196;
      fStack_12c = fVar32 * fVar197;
      fStack_128 = fVar34 * fVar198;
      uStack_124 = auVar164._28_4_;
      auVar78._4_4_ = fVar24 * fVar193 * fVar37;
      auVar78._0_4_ = fVar20 * fVar188 * fVar2;
      auVar78._8_4_ = fVar26 * fVar194 * fVar4;
      auVar78._12_4_ = fVar28 * fVar195 * fVar5;
      auVar78._16_4_ = fVar30 * fVar196 * fVar19;
      auVar78._20_4_ = fVar32 * fVar197 * fVar22;
      auVar78._24_4_ = fVar34 * fVar198 * fVar23;
      auVar78._28_4_ = auVar164._28_4_;
      auVar164 = vblendvps_avx(local_480,local_1e0,auVar108);
      auVar101 = vsubps_avx(auVar149,auVar78);
      local_2a0 = vblendvps_avx(auVar164,auVar101,auVar148);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = &DAT_3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar95._16_4_ = 0x3f800000;
      auVar95._20_4_ = 0x3f800000;
      auVar95._24_4_ = 0x3f800000;
      auVar95._28_4_ = 0x3f800000;
      local_1a0 = vandnps_avx(auVar108,auVar95);
      _local_220 = ZEXT1632(auVar36);
      auVar79._4_4_ = fVar37 * auVar36._4_4_;
      auVar79._0_4_ = fVar2 * auVar36._0_4_;
      auVar79._8_4_ = fVar4 * auVar36._8_4_;
      auVar79._12_4_ = fVar5 * auVar36._12_4_;
      auVar79._16_4_ = fVar19 * 0.0;
      auVar79._20_4_ = fVar22 * 0.0;
      auVar79._24_4_ = fVar23 * 0.0;
      auVar79._28_4_ = auVar119._28_4_;
      local_340 = vblendvps_avx(local_1a0,auVar79,auVar148);
      local_300._0_4_ = fVar168 + fVar114;
      local_300._4_4_ = fVar177 + fVar121;
      local_300._8_4_ = fVar179 + fVar123;
      local_300._12_4_ = fVar181 + fVar125;
      local_300._16_4_ = fVar182 + 0.0;
      local_300._20_4_ = fVar183 + 0.0;
      local_300._24_4_ = fVar100 + 0.0;
      local_300._28_4_ = auVar96._28_4_ + fStack_4c4;
      local_320 = ZEXT832(0) << 0x20;
      local_2e0 = local_3c0;
      local_2c0 = local_3e0;
      auVar96 = vpmovzxwd_avx2(auVar47);
      auVar96 = vpslld_avx2(auVar96,0x1f);
      auVar106._8_4_ = 0x7f800000;
      auVar106._0_8_ = 0x7f8000007f800000;
      auVar106._12_4_ = 0x7f800000;
      auVar106._16_4_ = 0x7f800000;
      auVar106._20_4_ = 0x7f800000;
      auVar106._24_4_ = 0x7f800000;
      auVar106._28_4_ = 0x7f800000;
      local_600 = local_300;
      auVar96 = vblendvps_avx(auVar106,local_300,auVar96);
      auVar119 = vshufps_avx(auVar96,auVar96,0xb1);
      auVar119 = vminps_avx(auVar96,auVar119);
      auVar164 = vshufpd_avx(auVar119,auVar119,5);
      auVar119 = vminps_avx(auVar119,auVar164);
      auVar164 = vpermpd_avx2(auVar119,0x4e);
      auVar119 = vminps_avx(auVar119,auVar164);
      auVar96 = vcmpps_avx(auVar96,auVar119,0);
      local_560 = auVar109;
      auVar119 = auVar109 & auVar96;
      auVar166 = ZEXT3264(CONCAT428(local_400,
                                    CONCAT424(local_400,
                                              CONCAT420(local_400,
                                                        CONCAT416(local_400,
                                                                  CONCAT412(local_400,
                                                                            CONCAT48(local_400,
                                                                                     CONCAT44(
                                                  local_400,local_400))))))));
      auVar163 = ZEXT3264(local_500);
      auVar175 = ZEXT3264(local_520);
      auVar192 = ZEXT3264(_local_4c0);
      auVar204 = ZEXT3264(local_420);
      auVar150 = ZEXT3264(local_440);
      auVar158 = ZEXT3264(local_460);
      auVar207 = ZEXT3264(local_580);
      if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar119 >> 0x7f,0) != '\0') ||
            (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar119 >> 0xbf,0) != '\0') ||
          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar119[0x1f] < '\0') {
        auVar109 = vandps_avx(auVar96,auVar109);
      }
      uVar84 = vmovmskps_avx(auVar109);
      uVar85 = 0;
      for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
        uVar85 = uVar85 + 1;
      }
      auVar187 = ZEXT3264(_local_540);
      _local_540 = auVar191;
      _local_4c0 = auVar203;
LAB_019055d9:
      auVar164 = auVar166._0_32_;
      auVar119 = auVar163._0_32_;
      auVar191 = auVar192._0_32_;
      auVar101 = auVar187._0_32_;
      auVar169 = auVar175._0_28_;
      auVar141 = auVar207._0_32_;
      auVar148 = auVar209._0_32_;
      auVar96 = auVar158._0_32_;
      auVar109 = auVar150._0_32_;
      auVar203 = auVar204._0_32_;
      uVar88 = (ulong)uVar85;
      local_618 = local_200[uVar88];
      pGVar14 = (pSVar87->geometries).items[local_618].ptr;
      if ((pGVar14->mask & (ray->super_RayK<1>).mask) == 0) {
        *(undefined4 *)(local_560 + uVar88 * 4) = 0;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          fVar2 = *(float *)(local_340 + uVar88 * 4);
          fVar37 = *(float *)(local_320 + uVar88 * 4);
          (ray->super_RayK<1>).tfar = *(float *)(local_300 + uVar88 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_2e0 + uVar88 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_2c0 + uVar88 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_2a0 + uVar88 * 4);
          ray->u = fVar2;
          ray->v = fVar37;
          ray->primID = (line->primIDs).field_0.i[uVar88];
          ray->geomID = local_618;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
LAB_019059aa:
          fVar2 = (ray->super_RayK<1>).tfar;
          auVar98._4_4_ = fVar2;
          auVar98._0_4_ = fVar2;
          auVar98._8_4_ = fVar2;
          auVar98._12_4_ = fVar2;
          auVar98._16_4_ = fVar2;
          auVar98._20_4_ = fVar2;
          auVar98._24_4_ = fVar2;
          auVar98._28_4_ = fVar2;
          auVar47 = vpand_avx(local_380,local_360);
          auVar108 = vcmpps_avx(_local_5a0,auVar98,2);
          auVar36 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
          auVar36 = vpand_avx(auVar36,auVar47);
          auVar108 = vpmovzxwd_avx2(auVar36);
          auVar108 = vpslld_avx2(auVar108,0x1f);
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar108 >> 0x7f,0) == '\0') &&
                (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar108 >> 0xbf,0) == '\0') &&
              (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar108[0x1f]) {
            return;
          }
          auVar38 = vcmpps_avx(local_a0,local_260,0);
          auVar109 = vblendvps_avx(auVar109,local_160,auVar38);
          auVar96 = vblendvps_avx(auVar96,local_1c0,auVar38);
          auVar148 = vblendvps_avx(auVar148,local_1e0,auVar38);
          auVar38 = vcmpps_avx(local_a0,local_240,0);
          auVar141 = vcmpps_avx(local_a0,auVar141,0);
          auVar38 = vorps_avx(auVar38,auVar141);
          fVar2 = local_a0._0_4_;
          fVar37 = local_a0._4_4_;
          fVar3 = local_a0._8_4_;
          fVar4 = local_a0._12_4_;
          fVar5 = local_a0._16_4_;
          fVar19 = local_a0._20_4_;
          fVar20 = local_a0._24_4_;
          auVar157._0_4_ =
               (float)local_280._0_4_ * (auVar101._0_4_ + auVar169._0_4_ * fVar2) + local_c0;
          auVar157._4_4_ =
               (float)local_280._4_4_ * (auVar101._4_4_ + auVar169._4_4_ * fVar37) + fStack_bc;
          auVar157._8_4_ = fStack_278 * (auVar101._8_4_ + auVar169._8_4_ * fVar3) + fStack_b8;
          auVar157._12_4_ = fStack_274 * (auVar101._12_4_ + auVar169._12_4_ * fVar4) + fStack_b4;
          auVar157._16_4_ = fStack_270 * (auVar101._16_4_ + auVar169._16_4_ * fVar5) + fStack_b0;
          auVar157._20_4_ = fStack_26c * (auVar101._20_4_ + auVar169._20_4_ * fVar19) + fStack_ac;
          auVar157._24_4_ = fStack_268 * (auVar101._24_4_ + auVar169._24_4_ * fVar20) + fStack_a8;
          auVar157._28_4_ = auVar101._28_4_ + auVar141._28_4_ + fStack_a4;
          auVar162._0_4_ =
               (float)local_280._0_4_ * (auVar191._0_4_ + fVar2 * auVar119._0_4_) + local_120;
          auVar162._4_4_ =
               (float)local_280._4_4_ * (auVar191._4_4_ + fVar37 * auVar119._4_4_) + fStack_11c;
          auVar162._8_4_ = fStack_278 * (auVar191._8_4_ + fVar3 * auVar119._8_4_) + fStack_118;
          auVar162._12_4_ = fStack_274 * (auVar191._12_4_ + fVar4 * auVar119._12_4_) + fStack_114;
          auVar162._16_4_ = fStack_270 * (auVar191._16_4_ + fVar5 * auVar119._16_4_) + fStack_110;
          auVar162._20_4_ = fStack_26c * (auVar191._20_4_ + fVar19 * auVar119._20_4_) + fStack_10c;
          auVar162._24_4_ = fStack_268 * (auVar191._24_4_ + fVar20 * auVar119._24_4_) + fStack_108;
          auVar162._28_4_ = auVar191._28_4_ + auVar119._28_4_ + fStack_104;
          auVar165._0_4_ =
               (float)local_280._0_4_ * (auVar203._0_4_ + auVar164._0_4_ * fVar2) + local_180;
          auVar165._4_4_ =
               (float)local_280._4_4_ * (auVar203._4_4_ + auVar164._4_4_ * fVar37) + fStack_17c;
          auVar165._8_4_ = fStack_278 * (auVar203._8_4_ + auVar164._8_4_ * fVar3) + fStack_178;
          auVar165._12_4_ = fStack_274 * (auVar203._12_4_ + auVar164._12_4_ * fVar4) + fStack_174;
          auVar165._16_4_ = fStack_270 * (auVar203._16_4_ + auVar164._16_4_ * fVar5) + fStack_170;
          auVar165._20_4_ = fStack_26c * (auVar203._20_4_ + auVar164._20_4_ * fVar19) + fStack_16c;
          auVar165._24_4_ = fStack_268 * (auVar203._24_4_ + auVar164._24_4_ * fVar20) + fStack_168;
          auVar165._28_4_ = auVar203._28_4_ + auVar164._28_4_ + fStack_164;
          auVar80._4_4_ = (float)local_80._4_4_ * fStack_dc;
          auVar80._0_4_ = (float)local_80._0_4_ * local_e0;
          auVar80._8_4_ = fStack_78 * fStack_d8;
          auVar80._12_4_ = fStack_74 * fStack_d4;
          auVar80._16_4_ = fStack_70 * fStack_d0;
          auVar80._20_4_ = fStack_6c * fStack_cc;
          auVar80._24_4_ = fStack_68 * fStack_c8;
          auVar80._28_4_ = uStack_264;
          auVar119 = vsubps_avx(auVar157,auVar80);
          auVar81._4_4_ = (float)local_80._4_4_ * fStack_fc;
          auVar81._0_4_ = (float)local_80._0_4_ * local_100;
          auVar81._8_4_ = fStack_78 * fStack_f8;
          auVar81._12_4_ = fStack_74 * fStack_f4;
          auVar81._16_4_ = fStack_70 * fStack_f0;
          auVar81._20_4_ = fStack_6c * fStack_ec;
          auVar81._24_4_ = fStack_68 * fStack_e8;
          auVar81._28_4_ = uStack_264;
          auVar164 = vsubps_avx(auVar162,auVar81);
          auVar82._4_4_ = (float)local_80._4_4_ * fStack_13c;
          auVar82._0_4_ = (float)local_80._0_4_ * local_140;
          auVar82._8_4_ = fStack_78 * fStack_138;
          auVar82._12_4_ = fStack_74 * fStack_134;
          auVar82._16_4_ = fStack_70 * fStack_130;
          auVar82._20_4_ = fStack_6c * fStack_12c;
          auVar82._24_4_ = fStack_68 * fStack_128;
          auVar82._28_4_ = uStack_264;
          auVar101 = vsubps_avx(auVar165,auVar82);
          local_2e0 = vblendvps_avx(auVar109,auVar119,auVar38);
          local_2c0 = vblendvps_avx(auVar96,auVar164,auVar38);
          local_2a0 = vblendvps_avx(auVar148,auVar101,auVar38);
          auVar83._4_4_ = (float)local_80._4_4_ * (float)local_220._4_4_;
          auVar83._0_4_ = (float)local_80._0_4_ * (float)local_220._0_4_;
          auVar83._8_4_ = fStack_78 * fStack_218;
          auVar83._12_4_ = fStack_74 * fStack_214;
          auVar83._16_4_ = fStack_70 * fStack_210;
          auVar83._20_4_ = fStack_6c * fStack_20c;
          auVar83._24_4_ = fStack_68 * fStack_208;
          auVar83._28_4_ = auVar119._28_4_;
          local_340 = vblendvps_avx(local_1a0,auVar83,auVar38);
          local_320 = ZEXT832(0) << 0x20;
          local_300 = _local_5a0;
          auVar120._8_4_ = 0x7f800000;
          auVar120._0_8_ = 0x7f8000007f800000;
          auVar120._12_4_ = 0x7f800000;
          auVar120._16_4_ = 0x7f800000;
          auVar120._20_4_ = 0x7f800000;
          auVar120._24_4_ = 0x7f800000;
          auVar120._28_4_ = 0x7f800000;
          auVar109 = vblendvps_avx(auVar120,_local_5a0,auVar108);
          auVar96 = vshufps_avx(auVar109,auVar109,0xb1);
          auVar96 = vminps_avx(auVar109,auVar96);
          auVar119 = vshufpd_avx(auVar96,auVar96,5);
          auVar96 = vminps_avx(auVar96,auVar119);
          auVar119 = vpermpd_avx2(auVar96,0x4e);
          auVar96 = vminps_avx(auVar96,auVar119);
          auVar109 = vcmpps_avx(auVar109,auVar96,0);
          auVar47 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
          auVar36 = vpand_avx(auVar47,auVar36);
          local_560 = vpsrad_avx2(auVar108,0x1f);
          pSVar87 = context->scene;
          auVar109 = vpmovzxwd_avx2(auVar36);
          auVar109 = vpslld_avx2(auVar109,0x1f);
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar109 >> 0x7f,0) == '\0') &&
                (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar109 >> 0xbf,0) == '\0') &&
              (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar109[0x1f]) {
            auVar109 = local_560;
          }
          uVar84 = vmovmskps_avx(auVar109);
          uVar85 = 0;
          for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
            uVar85 = uVar85 + 1;
          }
          do {
            uVar88 = (ulong)uVar85;
            local_618 = local_200[uVar88];
            pGVar14 = (pSVar87->geometries).items[local_618].ptr;
            if ((pGVar14->mask & (ray->super_RayK<1>).mask) == 0) {
              *(undefined4 *)(local_560 + uVar88 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar2 = *(float *)(local_340 + uVar88 * 4);
                fVar37 = *(float *)(local_320 + uVar88 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_300 + uVar88 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_2e0 + uVar88 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_2c0 + uVar88 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_2a0 + uVar88 * 4);
                ray->u = fVar2;
                ray->v = fVar37;
                ray->primID = (line->primIDs).field_0.i[uVar88];
                ray->geomID = local_618;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_630 = *(undefined4 *)(local_2e0 + uVar88 * 4);
              local_62c = *(undefined4 *)(local_2c0 + uVar88 * 4);
              local_628 = *(undefined4 *)(local_2a0 + uVar88 * 4);
              local_624 = *(undefined4 *)(local_340 + uVar88 * 4);
              local_620 = *(undefined4 *)(local_320 + uVar88 * 4);
              local_61c = (line->primIDs).field_0.i[uVar88];
              local_614 = context->user->instID[0];
              local_610 = context->user->instPrimID[0];
              local_600._0_4_ = (ray->super_RayK<1>).tfar;
              (ray->super_RayK<1>).tfar = *(float *)(local_300 + uVar88 * 4);
              local_644 = -1;
              local_5d0.valid = &local_644;
              local_5d0.geometryUserPtr = pGVar14->userPtr;
              local_5d0.context = context->user;
              local_5d0.ray = (RTCRayN *)ray;
              local_5d0.hit = (RTCHitN *)&local_630;
              local_5d0.N = 1;
              if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01905ce7:
                p_Var18 = context->args->filter;
                if (p_Var18 != (RTCFilterFunctionN)0x0) {
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                    (*p_Var18)(&local_5d0);
                    context = local_640;
                  }
                  if (*local_5d0.valid == 0) goto LAB_01905df5;
                }
                (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_5d0.hit;
                (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_5d0.hit + 4);
                (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_5d0.hit + 8);
                *(float *)((long)local_5d0.ray + 0x3c) = *(float *)(local_5d0.hit + 0xc);
                *(float *)((long)local_5d0.ray + 0x40) = *(float *)(local_5d0.hit + 0x10);
                *(float *)((long)local_5d0.ray + 0x44) = *(float *)(local_5d0.hit + 0x14);
                *(float *)((long)local_5d0.ray + 0x48) = *(float *)(local_5d0.hit + 0x18);
                *(float *)((long)local_5d0.ray + 0x4c) = *(float *)(local_5d0.hit + 0x1c);
                *(float *)((long)local_5d0.ray + 0x50) = *(float *)(local_5d0.hit + 0x20);
              }
              else {
                local_500._0_8_ = line;
                (*pGVar14->intersectionFilterN)(&local_5d0);
                context = local_640;
                line = (Primitive *)local_500._0_8_;
                if (*local_5d0.valid != 0) goto LAB_01905ce7;
LAB_01905df5:
                (ray->super_RayK<1>).tfar = (float)local_600._0_4_;
              }
              *(undefined4 *)(local_560 + uVar88 * 4) = 0;
              fVar2 = (ray->super_RayK<1>).tfar;
              auVar99._4_4_ = fVar2;
              auVar99._0_4_ = fVar2;
              auVar99._8_4_ = fVar2;
              auVar99._12_4_ = fVar2;
              auVar99._16_4_ = fVar2;
              auVar99._20_4_ = fVar2;
              auVar99._24_4_ = fVar2;
              auVar99._28_4_ = fVar2;
              auVar109 = vcmpps_avx(_local_5a0,auVar99,2);
              local_560 = vandps_avx(auVar109,local_560);
            }
            if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_560 >> 0x7f,0) == '\0') &&
                  (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_560 >> 0xbf,0) == '\0') &&
                (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_560[0x1f]) {
              return;
            }
            auVar110._8_4_ = 0x7f800000;
            auVar110._0_8_ = 0x7f8000007f800000;
            auVar110._12_4_ = 0x7f800000;
            auVar110._16_4_ = 0x7f800000;
            auVar110._20_4_ = 0x7f800000;
            auVar110._24_4_ = 0x7f800000;
            auVar110._28_4_ = 0x7f800000;
            auVar109 = vblendvps_avx(auVar110,_local_5a0,local_560);
            auVar96 = vshufps_avx(auVar109,auVar109,0xb1);
            auVar96 = vminps_avx(auVar109,auVar96);
            auVar119 = vshufpd_avx(auVar96,auVar96,5);
            auVar96 = vminps_avx(auVar96,auVar119);
            auVar119 = vpermpd_avx2(auVar96,0x4e);
            auVar96 = vminps_avx(auVar96,auVar119);
            auVar96 = vcmpps_avx(auVar109,auVar96,0);
            auVar119 = local_560 & auVar96;
            auVar109 = local_560;
            if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar119 >> 0x7f,0) != '\0') ||
                  (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0xbf,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar119[0x1f] < '\0') {
              auVar109 = vandps_avx(auVar96,local_560);
            }
            uVar84 = vmovmskps_avx(auVar109);
            uVar85 = 0;
            for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              uVar85 = uVar85 + 1;
            }
          } while( true );
        }
        local_630 = *(undefined4 *)(local_2e0 + uVar88 * 4);
        local_62c = *(undefined4 *)(local_2c0 + uVar88 * 4);
        local_628 = *(undefined4 *)(local_2a0 + uVar88 * 4);
        local_624 = *(undefined4 *)(local_340 + uVar88 * 4);
        local_620 = *(undefined4 *)(local_320 + uVar88 * 4);
        local_61c = (line->primIDs).field_0.i[uVar88];
        local_614 = context->user->instID[0];
        local_610 = context->user->instPrimID[0];
        local_4e0._0_4_ = (ray->super_RayK<1>).tfar;
        (ray->super_RayK<1>).tfar = *(float *)(local_300 + uVar88 * 4);
        local_644 = -1;
        local_5d0.valid = &local_644;
        local_5d0.geometryUserPtr = pGVar14->userPtr;
        local_5d0.context = context->user;
        local_5d0.ray = (RTCRayN *)ray;
        local_5d0.hit = (RTCHitN *)&local_630;
        local_5d0.N = 1;
        if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0190577c:
          p_Var18 = context->args->filter;
          if (p_Var18 != (RTCFilterFunctionN)0x0) {
            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
              (*p_Var18)(&local_5d0);
              auVar209 = ZEXT3264(local_480);
              auVar158 = ZEXT3264(local_460);
              auVar150 = ZEXT3264(local_440);
              auVar204 = ZEXT3264(local_420);
              auVar192 = ZEXT3264(_local_4c0);
              auVar187 = ZEXT3264(_local_540);
              auVar175 = ZEXT3264(local_520);
              auVar163 = ZEXT3264(local_500);
              auVar166 = ZEXT3264(CONCAT428(fStack_3e4,
                                            CONCAT424(fStack_3e8,
                                                      CONCAT420(fStack_3ec,
                                                                CONCAT416(fStack_3f0,
                                                                          CONCAT412(fStack_3f4,
                                                                                    CONCAT48(
                                                  fStack_3f8,CONCAT44(fStack_3fc,local_400))))))));
              auVar207 = ZEXT3264(local_580);
              context = local_640;
            }
            if (*local_5d0.valid == 0) goto LAB_019058e5;
          }
          (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.x = *(float *)local_5d0.hit;
          (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_5d0.hit + 4);
          (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_5d0.hit + 8);
          *(float *)((long)local_5d0.ray + 0x3c) = *(float *)(local_5d0.hit + 0xc);
          *(float *)((long)local_5d0.ray + 0x40) = *(float *)(local_5d0.hit + 0x10);
          *(float *)((long)local_5d0.ray + 0x44) = *(float *)(local_5d0.hit + 0x14);
          *(float *)((long)local_5d0.ray + 0x48) = *(float *)(local_5d0.hit + 0x18);
          *(float *)((long)local_5d0.ray + 0x4c) = *(float *)(local_5d0.hit + 0x1c);
          *(float *)((long)local_5d0.ray + 0x50) = *(float *)(local_5d0.hit + 0x20);
        }
        else {
          (*pGVar14->intersectionFilterN)(&local_5d0);
          auVar209 = ZEXT3264(local_480);
          auVar158 = ZEXT3264(local_460);
          auVar150 = ZEXT3264(local_440);
          auVar204 = ZEXT3264(local_420);
          auVar192 = ZEXT3264(_local_4c0);
          auVar187 = ZEXT3264(_local_540);
          auVar175 = ZEXT3264(local_520);
          auVar163 = ZEXT3264(local_500);
          auVar166 = ZEXT3264(CONCAT428(fStack_3e4,
                                        CONCAT424(fStack_3e8,
                                                  CONCAT420(fStack_3ec,
                                                            CONCAT416(fStack_3f0,
                                                                      CONCAT412(fStack_3f4,
                                                                                CONCAT48(fStack_3f8,
                                                                                         CONCAT44(
                                                  fStack_3fc,local_400))))))));
          auVar207 = ZEXT3264(local_580);
          context = local_640;
          pSVar87 = local_638;
          if (*local_5d0.valid != 0) goto LAB_0190577c;
LAB_019058e5:
          (ray->super_RayK<1>).tfar = (float)local_4e0._0_4_;
        }
        *(undefined4 *)(local_560 + uVar88 * 4) = 0;
        fVar2 = (ray->super_RayK<1>).tfar;
        auVar97._4_4_ = fVar2;
        auVar97._0_4_ = fVar2;
        auVar97._8_4_ = fVar2;
        auVar97._12_4_ = fVar2;
        auVar97._16_4_ = fVar2;
        auVar97._20_4_ = fVar2;
        auVar97._24_4_ = fVar2;
        auVar97._28_4_ = fVar2;
        auVar109 = vcmpps_avx(local_600,auVar97,2);
        local_560 = vandps_avx(auVar109,local_560);
      }
      auVar164 = auVar166._0_32_;
      auVar119 = auVar163._0_32_;
      auVar191 = auVar192._0_32_;
      auVar101 = auVar187._0_32_;
      auVar169 = auVar175._0_28_;
      auVar141 = auVar207._0_32_;
      auVar148 = auVar209._0_32_;
      auVar96 = auVar158._0_32_;
      auVar109 = auVar150._0_32_;
      auVar203 = auVar204._0_32_;
      if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_560 >> 0x7f,0) == '\0') &&
            (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_560 >> 0xbf,0) == '\0') &&
          (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_560[0x1f]) goto LAB_019059aa;
      auVar107._8_4_ = 0x7f800000;
      auVar107._0_8_ = 0x7f8000007f800000;
      auVar107._12_4_ = 0x7f800000;
      auVar107._16_4_ = 0x7f800000;
      auVar107._20_4_ = 0x7f800000;
      auVar107._24_4_ = 0x7f800000;
      auVar107._28_4_ = 0x7f800000;
      auVar109 = vblendvps_avx(auVar107,local_600,local_560);
      auVar96 = vshufps_avx(auVar109,auVar109,0xb1);
      auVar96 = vminps_avx(auVar109,auVar96);
      auVar119 = vshufpd_avx(auVar96,auVar96,5);
      auVar96 = vminps_avx(auVar96,auVar119);
      auVar119 = vpermpd_avx2(auVar96,0x4e);
      auVar96 = vminps_avx(auVar96,auVar119);
      auVar96 = vcmpps_avx(auVar109,auVar96,0);
      auVar119 = local_560 & auVar96;
      auVar109 = local_560;
      if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar119 >> 0x7f,0) != '\0') ||
            (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar119 >> 0xbf,0) != '\0') ||
          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar119[0x1f] < '\0') {
        auVar109 = vandps_avx(auVar96,local_560);
      }
      uVar84 = vmovmskps_avx(auVar109);
      uVar85 = 0;
      for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
        uVar85 = uVar85 + 1;
      }
      goto LAB_019055d9;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time());
        const vbool<M> valid = line.valid();
        ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Intersect1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }